

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateVirtualFunctionSet
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name,TypeClass *parent)

{
  FunctionData *pFVar1;
  TypeFunction *pTVar2;
  uint hash;
  int iVar3;
  undefined4 extraout_var;
  Node *pNVar5;
  TypeFunctionSet *pTVar6;
  ExprBase *pEVar7;
  ulong uVar8;
  Node *start;
  Node *pNVar9;
  Node *pNVar10;
  ArrayView<TypeBase_*> setTypes;
  NodeIterator NVar11;
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  TypeClass *local_100;
  IntrusiveList<FunctionHandle> local_d8;
  SmallArray<TypeBase_*,_16U> local_c8;
  FunctionHandle *pFVar4;
  undefined4 extraout_var_00;
  
  local_c8.allocator = ctx->allocator;
  local_c8.data = local_c8.little;
  local_c8.count = 0;
  local_c8.max = 0x10;
  local_d8.head = (FunctionHandle *)0x0;
  local_d8.tail = (FunctionHandle *)0x0;
  if (parent != (TypeClass *)0x0) {
    local_100 = parent;
    do {
      hash = NULLC::GetStringHash(name.begin,name.end);
      NVar11 = DirectChainedMap<FunctionData_*>::first(&local_100->methodMap,hash);
      if (NVar11.node != (Node *)0x0) {
LAB_0015f15b:
        pNVar10 = NVar11.node;
        pNVar9 = NVar11.start;
        pFVar1 = *(FunctionData **)(pNVar10 + 8);
        pTVar2 = pFVar1->type;
        pFVar4 = local_d8.head;
        if (local_d8.head != (FunctionHandle *)0x0 && (pTVar2->super_TypeBase).isGeneric == false) {
          do {
            if (pFVar4->function->type == pTVar2) {
              pNVar5 = *(Node **)(pNVar10 + 0x10);
              if (pNVar5 == pNVar9) goto LAB_0015f226;
              goto LAB_0015f214;
            }
            pFVar4 = pFVar4->next;
          } while (pFVar4 != (FunctionHandle *)0x0);
        }
        if (local_c8.count == local_c8.max) {
          SmallArray<TypeBase_*,_16U>::grow(&local_c8,local_c8.count);
        }
        if (local_c8.data == (TypeBase **)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                       );
        }
        uVar8 = (ulong)local_c8.count;
        local_c8.count = local_c8.count + 1;
        local_c8.data[uVar8] = &pTVar2->super_TypeBase;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pFVar4 = (FunctionHandle *)CONCAT44(extraout_var,iVar3);
        pFVar4->function = pFVar1;
        pFVar4->next = (FunctionHandle *)0x0;
        pFVar4->listed = false;
        IntrusiveList<FunctionHandle>::push_back(&local_d8,pFVar4);
        pNVar5 = *(Node **)(pNVar10 + 0x10);
        if (pNVar5 != pNVar9) {
          do {
            if (pNVar5 == (Node *)0x0) break;
            if (*(int *)pNVar5 == *(int *)pNVar10) goto LAB_0015f22b;
            pNVar5 = *(Node **)(pNVar5 + 0x10);
          } while (pNVar5 != pNVar9);
        }
        goto LAB_0015f226;
      }
LAB_0015f237:
      local_100 = local_100->baseClass;
    } while (local_100 != (TypeClass *)0x0);
  }
  if (local_d8.head == (FunctionHandle *)0x0) {
    if ((TypeStruct *)value->type == ctx->typeAutoRef) {
      anon_unknown.dwarf_9fd58::Stop
                (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
                 (ulong)(uint)((int)name.end - (int)name.begin));
    }
    pEVar7 = (ExprBase *)0x0;
  }
  else {
    setTypes.count = local_c8.count;
    setTypes.data = local_c8.data;
    setTypes._12_4_ = 0;
    pTVar6 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
    pEVar7->typeID = 0x27;
    pEVar7->source = source;
    pEVar7->type = &pTVar6->super_TypeBase;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229e80;
    pEVar7[1]._vptr_ExprBase = (_func_int **)local_d8.head;
    *(FunctionHandle **)&pEVar7[1].typeID = local_d8.tail;
    pEVar7[1].source = (SynBase *)value;
  }
  SmallArray<TypeBase_*,_16U>::~SmallArray(&local_c8);
  return pEVar7;
  while( true ) {
    if (*(int *)pNVar5 == *(int *)pNVar10) goto LAB_0015f22b;
    pNVar5 = *(Node **)(pNVar5 + 0x10);
    if (pNVar5 == pNVar9) break;
LAB_0015f214:
    if (pNVar5 == (Node *)0x0) break;
  }
LAB_0015f226:
  pNVar9 = (Node *)0x0;
  pNVar5 = (Node *)0x0;
LAB_0015f22b:
  NVar11.node = pNVar5;
  NVar11.start = pNVar9;
  if (pNVar5 == (Node *)0x0) goto LAB_0015f237;
  goto LAB_0015f15b;
}

Assistant:

ExprBase* CreateVirtualFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name, TypeClass *parent)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	for(TypeClass *curr = parent; curr; curr = curr->baseClass)
	{
		DirectChainedMap<FunctionData*>::NodeIterator it = curr->methodMap.first(name.hash());

		while(it)
		{
			FunctionData *function = it.node->value;

			FunctionHandle *prev = NULL;

			// Pointer to generic types don't stricly match because they might be resolved to different types
			if(!function->type->isGeneric)
			{
				for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
				{
					if(curr->function->type == function->type)
					{
						prev = curr;
						break;
					}
				}
			}

			if(prev)
			{
				it = curr->methodMap.next(it);
				continue;
			}

			types.push_back(function->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));

			it = curr->methodMap.next(it);
		}
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}